

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Mem * out2PrereleaseWithClear(Mem *pOut)

{
  Mem *pOut_local;
  
  sqlite3VdbeMemSetNull(pOut);
  pOut->flags = 4;
  return pOut;
}

Assistant:

static SQLITE_NOINLINE Mem *out2PrereleaseWithClear(Mem *pOut){
  sqlite3VdbeMemSetNull(pOut);
  pOut->flags = MEM_Int;
  return pOut;
}